

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scanner.c
# Opt level: O2

Symbol token_end_layout_texp(Env *env)

{
  uint uVar1;
  ContextSort CVar2;
  _Bool _Var3;
  Symbol SVar4;
  uint uVar5;
  
  if ((env->symbols[9] == true) && (_Var3 = is_layout_context(env), _Var3)) {
    uVar1 = (env->state->contexts).size;
    if (1 < uVar1) {
      uVar5 = uVar1 - 2;
      do {
        if ((int)uVar5 < 0) {
          return FAIL;
        }
        if (uVar1 <= uVar5) {
          __assert_fail("(uint32_t)(i) < (&env->state->contexts)->size",
                        "/workspace/llm4binary/github/license_c_cmakelists/tree-sitter[P]tree-sitter-haskell/src/scanner.c"
                        ,0x7c4,"_Bool layouts_in_texp(Env *)");
        }
        CVar2 = (env->state->contexts).contents[uVar5].sort;
        if ((CVar2 & ~DoLayout) == Braces) {
          SVar4 = end_layout(env,(char *)(ulong)CVar2);
          return SVar4;
        }
        uVar5 = uVar5 - 1;
      } while (CVar2 < TExp);
    }
  }
  return FAIL;
}

Assistant:

static Symbol token_end_layout_texp(Env *env) {
  return (valid(env, END) && layouts_in_texp(env)) ? end_layout(env, "texp") : FAIL;
}